

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_with_concurrent_updates_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t keylen;
  size_t bodylen;
  char *__format;
  ulong uVar6;
  fdb_seqnum_t fVar7;
  long lVar8;
  fdb_doc *rdoc;
  fdb_iterator *itr;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_kvs_config local_3b0;
  timeval __test_begin;
  fdb_doc *local_388 [11];
  fdb_config local_330;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  local_330.seqtree_opt = '\x01';
  fdb_get_default_kvs_config();
  fdb_open(&dbfile,"./iterator_test1",&local_330);
  fdb_kvs_open_default(dbfile,&db1,&local_3b0);
  fVar4 = fdb_set_log_callback(db1,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x15e);
    iterator_with_concurrent_updates_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x15e,"void iterator_with_concurrent_updates_test()");
  }
  fdb_kvs_open_default(dbfile,&db2,&local_3b0);
  fVar4 = fdb_set_log_callback(db2,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x163);
    iterator_with_concurrent_updates_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x163,"void iterator_with_concurrent_updates_test()");
  }
  fdb_kvs_open_default(dbfile,&db3,&local_3b0);
  fVar4 = fdb_set_log_callback(db3,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x168);
    iterator_with_concurrent_updates_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x168,"void iterator_with_concurrent_updates_test()");
  }
  lVar8 = 0;
  for (uVar6 = 0; uVar6 != 10; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar6 & 0xffffffff);
    keylen = strlen(keybuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_388 + lVar8),keybuf,keylen,(void *)0x0,0,bodybuf,bodylen
                  );
    fdb_set(db1,local_388[uVar6]);
    lVar8 = lVar8 + 8;
  }
  fdb_commit(dbfile,'\x01');
  lVar8 = 0;
  fdb_iterator_init(db2,&itr,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(itr,&rdoc);
    doc = rdoc;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x179);
      iterator_with_concurrent_updates_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x179,"void iterator_with_concurrent_updates_test()");
    }
    pvVar1 = rdoc->key;
    pfVar2 = local_388[lVar8];
    pvVar3 = pfVar2->key;
    iVar5 = bcmp(pvVar1,pvVar3,rdoc->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x17a);
      iterator_with_concurrent_updates_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x17a,"void iterator_with_concurrent_updates_test()");
    }
    pvVar1 = doc->body;
    pvVar3 = pfVar2->body;
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x17b);
      iterator_with_concurrent_updates_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x17b,"void iterator_with_concurrent_updates_test()");
    }
    lVar8 = lVar8 + 1;
    fdb_doc_free(doc);
    rdoc = (fdb_doc *)0x0;
    fVar4 = fdb_iterator_next(itr);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(itr);
  if (lVar8 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x181);
    iterator_with_concurrent_updates_test()::__test_pass = 1;
    __assert_fail("r == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x181,"void iterator_with_concurrent_updates_test()");
  }
  fdb_iterator_sequence_init(db3,&itr,0,0,0);
  fVar7 = 1;
  do {
    fVar4 = fdb_iterator_get(itr,&rdoc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x188);
      iterator_with_concurrent_updates_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x188,"void iterator_with_concurrent_updates_test()");
    }
    if (fVar7 != rdoc->seqnum) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x18a);
      iterator_with_concurrent_updates_test()::__test_pass = '\x01';
      if (fVar7 != rdoc->seqnum) {
        __assert_fail("rdoc->seqnum == (fdb_seqnum_t)r",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x18a,"void iterator_with_concurrent_updates_test()");
      }
    }
    fdb_doc_free(rdoc);
    rdoc = (fdb_doc *)0x0;
    fVar4 = fdb_iterator_next(itr);
    fVar7 = fVar7 + 1;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(itr);
  if (fVar7 == 0xb) {
    fdb_close(dbfile);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      fdb_doc_free(local_388[lVar8]);
    }
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (iterator_with_concurrent_updates_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"iterator with concurrent updates test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,399);
  iterator_with_concurrent_updates_test()::__test_pass = 1;
  __assert_fail("r == n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,399,"void iterator_with_concurrent_updates_test()");
}

Assistant:

void iterator_with_concurrent_updates_test()
{
    // unit test for MB-12287
    TEST_INIT();
    memleak_start();

    int i, n=10;
    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_iterator *itr;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    char keybuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db1, db2, db3 on the same file
    fconfig = fdb_get_default_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    fdb_open(&dbfile, "./iterator_test1", &fconfig);

    fdb_kvs_open_default(dbfile, &db1, &kvs_config);
    status = fdb_set_log_callback(db1, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db2, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db3, &kvs_config);
    status = fdb_set_log_callback(db3, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs using db1
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf), NULL, 0,
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // create an iterator using db2
    fdb_iterator_init(db2, &itr, NULL, 0, NULL, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[r]->key, rdoc->keylen);
        TEST_CMP(rdoc->body, doc[r]->body, rdoc->bodylen);
        r++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    // same for sequence number
    fdb_iterator_sequence_init(db3, &itr, 0, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        r++;
        TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)r);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator with concurrent updates test");
}